

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_generator.cpp
# Opt level: O3

uint32_t __thiscall randomx::Blake2Generator::getUInt32(Blake2Generator *this)

{
  uint32_t uVar1;
  size_t sVar2;
  
  sVar2 = this->dataIndex;
  if (sVar2 - 0x3d < 0xffffffffffffffbf) {
    sVar2 = 0;
    randomx_blake2b(this,0x40,this,0x40,(void *)0x0,0);
    this->dataIndex = 0;
  }
  uVar1 = *(uint32_t *)(this->data + sVar2);
  this->dataIndex = sVar2 + 4;
  return uVar1;
}

Assistant:

uint32_t Blake2Generator::getUInt32() {
		checkData(4);
		auto ret = load32(&data[dataIndex]);
		dataIndex += 4;
		return ret;
	}